

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O0

CURLcode pop3_done(Curl_easy *data,CURLcode status,_Bool premature)

{
  IMAP *pIVar1;
  POP3 *pop3;
  CURLcode result;
  _Bool premature_local;
  CURLcode status_local;
  Curl_easy *data_local;
  
  pop3._4_4_ = CURLE_OK;
  pIVar1 = (data->req).p.imap;
  if (pIVar1 == (IMAP *)0x0) {
    data_local._4_4_ = CURLE_OK;
  }
  else {
    if (status != CURLE_OK) {
      Curl_conncontrol(data->conn,1);
      pop3._4_4_ = status;
    }
    (*Curl_cfree)(pIVar1->mailbox);
    pIVar1->mailbox = (char *)0x0;
    (*Curl_cfree)(pIVar1->uidvalidity);
    pIVar1->uidvalidity = (char *)0x0;
    pIVar1->transfer = PPTRANSFER_BODY;
    data_local._4_4_ = pop3._4_4_;
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode pop3_done(struct Curl_easy *data, CURLcode status,
                          bool premature)
{
  CURLcode result = CURLE_OK;
  struct POP3 *pop3 = data->req.p.pop3;

  (void)premature;

  if(!pop3)
    return CURLE_OK;

  if(status) {
    connclose(data->conn, "POP3 done with bad status");
    result = status;         /* use the already set error code */
  }

  /* Cleanup our per-request based variables */
  Curl_safefree(pop3->id);
  Curl_safefree(pop3->custom);

  /* Clear the transfer mode for the next request */
  pop3->transfer = PPTRANSFER_BODY;

  return result;
}